

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<testing::ActionInterface<int_()>_> * __thiscall
testing::internal::linked_ptr<testing::ActionInterface<int_()>_>::operator=
          (linked_ptr<testing::ActionInterface<int_()>_> *this,
          linked_ptr<testing::ActionInterface<int_()>_> *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::ActionInterface<int()>>::copy<testing::ActionInterface<int()>>
              ((linked_ptr<testing::ActionInterface<int()>> *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }